

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if ((*(uint *)&pNode->field_0x14 & 0x10) != 0) {
    return;
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    Abc_NodeConeMarkCollect_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vVisited);
    Abc_NodeConeMarkCollect_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],vVisited);
  }
  if ((*(uint *)&pNode->field_0x14 & 0x10) != 0) {
    __assert_fail("pNode->fMarkA == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x1e5,"void Abc_NodeConeMarkCollect_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 | 0x10;
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_002fc2bf;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar2;
    }
    vVisited->nCap = iVar3;
  }
LAB_002fc2bf:
  iVar3 = vVisited->nSize;
  vVisited->nSize = iVar3 + 1;
  vVisited->pArray[iVar3] = pNode;
  return;
}

Assistant:

void Abc_NodeConeMarkCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vVisited )
{
    if ( pNode->fMarkA == 1 )
        return;
    // visit transitive fanin 
    if ( Abc_ObjIsNode(pNode) )
    {
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin0(pNode), vVisited );
        Abc_NodeConeMarkCollect_rec( Abc_ObjFanin1(pNode), vVisited );
    }
    assert( pNode->fMarkA == 0 );
    pNode->fMarkA = 1;
    Vec_PtrPush( vVisited, pNode );
}